

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

void cpool_close_and_destroy(cpool *cpool,connectdata *conn,Curl_easy *data,_Bool do_shutdown)

{
  _Bool done;
  _Bool local_19;
  
  if (data == (Curl_easy *)0x0) {
    data = cpool->idata;
  }
  Curl_attach_connection(data,conn);
  cpool_run_conn_shutdown_handler(data,conn);
  if (do_shutdown) {
    cpool_run_conn_shutdown(data,conn,&local_19);
  }
  Curl_conn_close(data,1);
  Curl_conn_close(data,0);
  Curl_detach_connection(data);
  Curl_conn_free(data,conn);
  return;
}

Assistant:

static void cpool_close_and_destroy(struct cpool *cpool,
                                    struct connectdata *conn,
                                    struct Curl_easy *data,
                                    bool do_shutdown)
{
  bool done;

  /* there must be a connection to close */
  DEBUGASSERT(conn);
  /* it must be removed from the connection pool */
  DEBUGASSERT(!conn->bits.in_cpool);
  /* there must be an associated transfer */
  DEBUGASSERT(data || cpool);
  if(!data)
    data = cpool->idata;

  /* the transfer must be detached from the connection */
  DEBUGASSERT(data && !data->conn);

  Curl_attach_connection(data, conn);

  cpool_run_conn_shutdown_handler(data, conn);
  if(do_shutdown) {
    /* Make a last attempt to shutdown handlers and filters, if
     * not done so already. */
    cpool_run_conn_shutdown(data, conn, &done);
  }

  if(cpool)
    DEBUGF(infof(data, "[CCACHE] closing #%" FMT_OFF_T,
                 conn->connection_id));
  else
    DEBUGF(infof(data, "closing connection #%" FMT_OFF_T,
                 conn->connection_id));
  Curl_conn_close(data, SECONDARYSOCKET);
  Curl_conn_close(data, FIRSTSOCKET);
  Curl_detach_connection(data);

  Curl_conn_free(data, conn);
}